

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Database.cpp
# Opt level: O3

void __thiscall
SQLite::Database::loadExtension(Database *this,char *apExtensionName,char *apEntryPointName)

{
  int iVar1;
  
  iVar1 = sqlite3_db_config((this->mSQLitePtr)._M_t.
                            super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
                            super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
                            super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl,0x3ed,1);
  check(this,iVar1);
  iVar1 = sqlite3_load_extension
                    ((this->mSQLitePtr)._M_t.
                     super___uniq_ptr_impl<sqlite3,_SQLite::Database::Deleter>._M_t.
                     super__Tuple_impl<0UL,_sqlite3_*,_SQLite::Database::Deleter>.
                     super__Head_base<0UL,_sqlite3_*,_false>._M_head_impl,apExtensionName,
                     apEntryPointName,(char **)0x0);
  check(this,iVar1);
  return;
}

Assistant:

void Database::loadExtension(const char* apExtensionName, const char *apEntryPointName)
{
#ifdef SQLITE_OMIT_LOAD_EXTENSION
    // Unused
    (void)apExtensionName;
    (void)apEntryPointName;

    throw SQLite::Exception("sqlite extensions are disabled");
#else
#ifdef SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION // Since SQLite 3.13 (2016-05-18):
    // Security warning:
    // It is recommended that the SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION method be used to enable only this interface.
    // The use of the sqlite3_enable_load_extension() interface should be avoided to keep the SQL load_extension()
    // disabled and prevent SQL injections from giving attackers access to extension loading capabilities.
    // (NOTE: not using nullptr: cannot pass object of non-POD type 'std::__1::nullptr_t' through variadic function)
    int ret = sqlite3_db_config(getHandle(), SQLITE_DBCONFIG_ENABLE_LOAD_EXTENSION, 1, NULL); // NOTE: not using nullptr
#else
    int ret = sqlite3_enable_load_extension(getHandle(), 1);
#endif
    check(ret);

    ret = sqlite3_load_extension(getHandle(), apExtensionName, apEntryPointName, 0);
    check(ret);
#endif
}